

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O1

RK_S32 vpu_decode_demo(VpuApiDemoCmdContext_t *cmd)

{
  bool bVar1;
  bool bVar2;
  VpuCodecContext_t *pVVar3;
  RK_S32 RVar4;
  uint uVar5;
  FILE *__stream;
  RK_U8 *pRVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  undefined8 uVar10;
  VPUMemLinear_t *pVVar11;
  char *pcVar12;
  RK_U8 **ppRVar13;
  int iVar14;
  DecoderOut_t *pDVar15;
  RK_S32 pkt_size;
  RK_U32 extraSize;
  DecoderOut_t decOut;
  FILE *local_c8;
  uint local_bc;
  RK_U8 *local_b8;
  uint local_ac;
  VPUMemLinear_t *local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  VideoPacket_t local_88;
  DecoderOut_t local_58;
  
  local_bc = 0;
  local_ac = 0;
  if (cmd == (VpuApiDemoCmdContext_t *)0x0) {
    return -1;
  }
  if ((((cmd->have_input == '\0') || (cmd->width == 0)) || (cmd->height == 0)) ||
     (cmd->coding < OMX_RK_VIDEO_CodingMPEG2)) {
    puts("Warning: missing needed parameters for vpu api demo");
  }
  if (cmd->have_input == '\0') {
    pcVar12 = "please set input bitstream file";
LAB_00101881:
    puts(pcVar12);
    __stream = (FILE *)0x0;
LAB_00101895:
    bVar1 = true;
    ppRVar13 = (RK_U8 **)&DAT_00000010;
    uVar10 = 0xffffff9b;
    local_c8 = (FILE *)0x0;
    pDVar15 = (DecoderOut_t *)0x0;
  }
  else {
    pcVar12 = "encode";
    if (cmd->codec_type == CODEC_DECODER) {
      pcVar12 = "decode";
    }
    printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",(ulong)cmd->width,
           (ulong)cmd->height,(ulong)cmd->coding,pcVar12,cmd->input_file);
    __stream = fopen(cmd->input_file,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar12 = "input file not exsist";
      goto LAB_00101881;
    }
    if (cmd->have_output != '\0') {
      printf("vpu api demo output file: %s\n",cmd->output_file);
      local_c8 = fopen(cmd->output_file,"wb");
      if (local_c8 != (FILE *)0x0) {
        if (cmd->record_frames == 0) {
          cmd->record_frames = 5;
        }
        goto LAB_0010198c;
      }
      puts("can not write output file");
      goto LAB_00101895;
    }
    local_c8 = (FILE *)0x0;
LAB_0010198c:
    ppRVar13 = &local_88.data;
    fseek(__stream,0,2);
    local_98 = ftell(__stream);
    fseek(__stream,0,0);
    local_88.data = (RK_U8 *)0x0;
    local_88.size = 0;
    local_88.capability = 0;
    local_88.nFlags = 0;
    local_88._36_4_ = 0;
    local_88.pts = -0x8000000000000000;
    local_88.dts = -0x8000000000000000;
    pDVar15 = &local_58;
    local_58.data = (RK_U8 *)0x0;
    local_58._8_8_ = 0;
    local_58.timeUs = 0;
    local_58.nFlags = 0;
    local_58._28_4_ = 0;
    RVar4 = (*vpuapi_open_ctx)(&ctx);
    uVar10 = 0xffffff98;
    if ((RVar4 == 0) && (ctx != (VpuCodecContext_t *)0x0)) {
      RVar4 = readBytesFromFile((RK_U8 *)&local_ac,4,(FILE *)__stream);
      uVar10 = 0xffffff99;
      if (RVar4 == 0) {
        printf("codec extra data size: %d\n");
        local_a8 = (VPUMemLinear_t *)(ulong)local_ac;
        pRVar6 = (RK_U8 *)malloc((size_t)local_a8);
        if (pRVar6 != (RK_U8 *)0x0) {
          bVar2 = false;
          local_b8 = pRVar6;
          memset(pRVar6,0,(size_t)local_a8);
          RVar4 = readBytesFromFile(local_b8,(RK_S32)local_a8,(FILE *)__stream);
          pVVar3 = ctx;
          if (RVar4 == 0) {
            ctx->codecType = cmd->codec_type;
            pVVar3->videoCoding = cmd->coding;
            pVVar3->width = cmd->width;
            pVVar3->height = cmd->height;
            pVVar3->no_thread = 1;
            uVar5 = (*pVVar3->init)(pVVar3,local_b8,local_ac);
            if (uVar5 == 0) {
              iVar14 = (int)local_98;
              printf("init vpu api context ok, fileSize: %d\n",local_98 & 0xffffffff);
              local_98 = (ulong)iVar14;
              local_a8 = (VPUMemLinear_t *)0x0;
              local_90 = 0;
              do {
                lVar7 = ftell(__stream);
                if ((long)local_98 <= lVar7) {
                  puts("read end of file, complete");
                  uVar10 = 0;
                  bVar2 = true;
                  break;
                }
                if (local_88.size == 0) {
                  RVar4 = readBytesFromFile((RK_U8 *)&local_bc,4,(FILE *)__stream);
                  uVar5 = local_bc;
                  bVar2 = true;
                  if (RVar4 == 0) {
                    if (local_88.data == (RK_U8 *)0x0) {
                      local_88.data = (RK_U8 *)malloc((long)(int)local_bc);
                      if (local_88.data != (RK_U8 *)0x0) {
                        local_88.capability = uVar5;
                        goto LAB_00101bcb;
                      }
LAB_00101e04:
                      bVar2 = false;
                      uVar10 = 0xffffff98;
                      break;
                    }
LAB_00101bcb:
                    if (local_88.capability < local_bc) {
                      local_88.data = (RK_U8 *)realloc(local_88.data,(long)(int)local_bc);
                      if (local_88.data == (RK_U8 *)0x0) goto LAB_00101e04;
                      local_88.capability = local_bc;
                    }
                    RVar4 = readBytesFromFile(local_88.data,local_bc,(FILE *)__stream);
                    lVar7 = local_90;
                    uVar5 = local_bc;
                    if (RVar4 == 0) {
                      local_88.size = local_bc;
                      local_88.pts = local_90;
                      local_a0 = local_90 + 40000;
                      lVar8 = ftell(__stream);
                      printf("read one packet, size: %d, pts: %lld, filePos: %ld\n",(ulong)uVar5,
                             lVar7,lVar8);
                      local_90 = local_a0;
                      goto LAB_00101c56;
                    }
                  }
                  uVar10 = 0;
                  break;
                }
LAB_00101c56:
                local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
                RVar4 = (*ctx->decode_sendstream)(ctx,&local_88);
                if (RVar4 != 0) {
                  bVar2 = false;
                  printf("send packet failed");
                  uVar10 = 0xffffff42;
                  break;
                }
                RVar4 = (*ctx->decode_getframe)(ctx,&local_58);
                if (RVar4 != 0) {
                  puts("get decoded data failed");
                  uVar10 = 0xffffff42;
                  bVar2 = false;
                  break;
                }
                printf("vpu decode one frame, out len: %d, left size: %d\n",
                       local_58._8_8_ & 0xffffffff,local_88._24_8_ & 0xffffffff);
                pRVar6 = local_58.data;
                if ((local_58.size != 0) && (local_58.data != (RK_U8 *)0x0)) {
                  pVVar11 = (VPUMemLinear_t *)(local_58.data + 0x40);
                  (*vpuapi_mem_link)(pVVar11);
                  uVar5 = (uint)local_a8;
                  uVar9 = uVar5;
                  if ((local_c8 != (FILE *)0x0) && (uVar9 = uVar5 + 1, uVar5 < cmd->record_frames))
                  {
                    uVar5 = (*(int *)(pRVar6 + 0x1c) + 0xfU & 0xfffffff0) *
                            (*(int *)(pRVar6 + 0x18) + 0xfU & 0xffffff0) * 3 >> 1;
                    local_a0 = CONCAT44(local_a0._4_4_,uVar9);
                    local_a8 = pVVar11;
                    printf("write %d frame(yuv420sp) data, %d bytes to file\n",(ulong)uVar9,
                           (ulong)uVar5);
                    pVVar11 = local_a8;
                    fwrite(*(void **)(pRVar6 + 0x48),1,(ulong)uVar5,local_c8);
                    fflush(local_c8);
                    uVar9 = (uint)local_a0;
                  }
                  (*vpuapi_mem_free)(pVVar11);
                  free(local_58.data);
                  local_58.data = (RK_U8 *)0x0;
                  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
                  local_a8 = (VPUMemLinear_t *)(ulong)uVar9;
                }
                usleep(3000);
                uVar10 = 0;
                bVar2 = true;
              } while (ctx->decoder_err == 0);
            }
            else {
              bVar2 = false;
              printf("init vpu api context fail, ret: 0x%X\n",(ulong)uVar5);
              uVar10 = 0xffffff97;
            }
          }
          pDVar15 = &local_58;
          bVar1 = false;
          pRVar6 = local_b8;
          goto LAB_001018a0;
        }
        uVar10 = 0xffffff98;
      }
      bVar2 = false;
      bVar1 = false;
      pRVar6 = (RK_U8 *)0x0;
      goto LAB_001018a0;
    }
    bVar1 = false;
  }
  bVar2 = false;
  pRVar6 = (RK_U8 *)0x0;
LAB_001018a0:
  if ((!bVar1) && (*ppRVar13 != (RK_U8 *)0x0)) {
    free(*ppRVar13);
    *ppRVar13 = (RK_U8 *)0x0;
  }
  if ((pDVar15 != (DecoderOut_t *)0x0) && (pDVar15->data != (RK_U8 *)0x0)) {
    free(pDVar15->data);
    pDVar15->data = (RK_U8 *)0x0;
  }
  if (pRVar6 != (RK_U8 *)0x0) {
    free(pRVar6);
  }
  if (ctx != (VpuCodecContext_t *)0x0) {
    (*vpuapi_close_ctx)(&ctx);
    ctx = (VpuCodecContext_t *)0x0;
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (local_c8 != (FILE *)0x0) {
    fclose(local_c8);
  }
  if (bVar2) {
    puts("encode demo complete OK.");
  }
  else {
    printf("decode demo fail, err: %d\n",uVar10);
  }
  return (RK_S32)uVar10;
}

Assistant:

static RK_S32 vpu_decode_demo(VpuApiDemoCmdContext_t *cmd)
{
    FILE *pInFile = NULL;
    FILE *pOutFile = NULL;
    RK_S32 fileSize = 0, pkt_size = 0;
    RK_S32 ret = 0;
    RK_U32 frame_count = 0;
    DecoderOut_t    decOut;
    VideoPacket_t demoPkt;
    VideoPacket_t *pkt = NULL;
    DecoderOut_t *pOut = NULL;
    VPU_FRAME *frame = NULL;
    RK_S64 fakeTimeUs = 0;
    RK_U8 *pExtra = NULL;
    RK_U32 extraSize = 0;
    RK_U32 wAlign16  = 0;
    RK_U32 hAlign16  = 0;
    RK_U32 frameSize = 0;

    if (cmd == NULL) {
        return -1;
    }

    if ((cmd->have_input == 0) || (cmd->width <= 0) || (cmd->height <= 0)
        || (cmd->coding <= OMX_RK_VIDEO_CodingAutoDetect)) {
        printf("Warning: missing needed parameters for vpu api demo\n");
    }

    if (cmd->have_input) {
        printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",
               cmd->width, cmd->height, cmd->coding,
               cmd->codec_type == CODEC_DECODER ? "decode" : "encode",
               cmd->input_file);

        pInFile = fopen(cmd->input_file, "rb");
        if (pInFile == NULL) {
            printf("input file not exsist\n");
            DECODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    } else {
        printf("please set input bitstream file\n");
        DECODE_ERR_RET(ERROR_INVALID_PARAM);
    }

    if (cmd->have_output) {
        printf("vpu api demo output file: %s\n",
               cmd->output_file);
        pOutFile = fopen(cmd->output_file, "wb");
        if (pOutFile == NULL) {
            printf("can not write output file\n");
            DECODE_ERR_RET(ERROR_INVALID_PARAM);
        }
        if (cmd->record_frames == 0)
            cmd->record_frames = 5;
    }

    fseek(pInFile, 0L, SEEK_END);
    fileSize = ftell(pInFile);
    fseek(pInFile, 0L, SEEK_SET);

    memset(&demoPkt, 0, sizeof(VideoPacket_t));
    pkt = &demoPkt;
    pkt->data = NULL;
    pkt->pts = VPU_API_NOPTS_VALUE;
    pkt->dts = VPU_API_NOPTS_VALUE;

    memset(&decOut, 0, sizeof(DecoderOut_t));
    pOut = &decOut;

    ret = vpuapi_open_ctx(&ctx);
    if (ret || (ctx == NULL)) {
        DECODE_ERR_RET(ERROR_MEMORY);
    }

    /*
     ** read codec extra data from input stream file.
    */
    if (readBytesFromFile((RK_U8 *)(&extraSize), 4, pInFile)) {
        DECODE_ERR_RET(ERROR_IO);
    }

    printf("codec extra data size: %d\n", extraSize);

    pExtra = (RK_U8 *)(malloc)(extraSize);
    if (pExtra == NULL) {
        DECODE_ERR_RET(ERROR_MEMORY);
    }
    memset(pExtra, 0, extraSize);

    if (readBytesFromFile(pExtra, extraSize, pInFile)) {
        DECODE_ERR_RET(ERROR_IO);
    }

    /*
     ** now init vpu api context. codecType, codingType, width ,height
     ** are all needed before init.
    */
    ctx->codecType = cmd->codec_type;
    ctx->videoCoding = cmd->coding;
    ctx->width = cmd->width;
    ctx->height = cmd->height;
    ctx->no_thread = 1;

    if ((ret = ctx->init(ctx, pExtra, extraSize)) != 0) {
        printf("init vpu api context fail, ret: 0x%X\n", ret);
        DECODE_ERR_RET(ERROR_INIT_VPU);
    }

    /*
     ** vpu api decoder process.
    */
    printf("init vpu api context ok, fileSize: %d\n", fileSize);

    do {
        if (ftell(pInFile) >= fileSize) {
            printf("read end of file, complete\n");
            break;
        }

        if (pkt && (pkt->size == 0)) {
            if (readBytesFromFile((RK_U8 *)(&pkt_size), 4, pInFile)) {
                break;
            }

            if (pkt->data == NULL) {
                pkt->data = (RK_U8 *)(malloc)(pkt_size);
                if (pkt->data == NULL) {
                    DECODE_ERR_RET(ERROR_MEMORY);
                }
                pkt->capability = pkt_size;
            }

            if (pkt->capability < ((RK_U32)pkt_size)) {
                pkt->data = (RK_U8 *)(realloc)((void *)(pkt->data), pkt_size);
                if (pkt->data == NULL) {
                    DECODE_ERR_RET(ERROR_MEMORY);
                }
                pkt->capability = pkt_size;
            }

            if (readBytesFromFile(pkt->data, pkt_size, pInFile)) {
                break;
            } else {
                pkt->size = pkt_size;
                pkt->pts = fakeTimeUs;
                fakeTimeUs += 40000;
            }

            printf("read one packet, size: %d, pts: %lld, filePos: %ld\n",
                   pkt->size, pkt->pts, ftell(pInFile));
        }

        /* note: must set out put size to 0 before do decoder. */
        pOut->size = 0;

        if (ctx->decode_sendstream(ctx, pkt) != 0) {
            printf("send packet failed");
            DECODE_ERR_RET(ERROR_VPU_DECODE);
        }


        if ((ret = ctx->decode_getframe(ctx, pOut)) != 0) {
            printf("get decoded data failed\n");
            DECODE_ERR_RET(ERROR_VPU_DECODE);
        } else {
            printf("vpu decode one frame, out len: %d, left size: %d\n",
                   pOut->size, pkt->size);

            /*
             ** both virtual and physical address of the decoded frame are contained
             ** in structure named VPU_FRAME, if you want to use virtual address, make
             ** sure you have done VPUMemLink before.
            */
            if ((pOut->size) && (pOut->data)) {
                frame = (VPU_FRAME *)(pOut->data);
                vpuapi_mem_link(&frame->vpumem);
                wAlign16 = ((frame->DisplayWidth + 15) & (~15));
                hAlign16 = ((frame->DisplayHeight + 15) & (~15));
                frameSize = wAlign16 * hAlign16 * 3 / 2;

                if (pOutFile && (frame_count++ < cmd->record_frames)) {
                    printf("write %d frame(yuv420sp) data, %d bytes to file\n",
                           frame_count, frameSize);

                    fwrite((RK_U8 *)(frame->vpumem.vir_addr), 1, frameSize, pOutFile);
                    fflush(pOutFile);
                }

                /*
                 ** remember use VPUFreeLinear to free, other wise memory leak will
                 ** give you a surprise.
                */
                vpuapi_mem_free(&frame->vpumem);
                // NOTE: pOut->data is malloc from vpu_api we need to free it.
                free(pOut->data);
                pOut->data = NULL;
                pOut->size = 0;
            }
        }

        usleep(3000);
    } while (!(ctx->decoder_err));

DECODE_OUT:
    if (pkt && pkt->data) {
        free(pkt->data);
        pkt->data = NULL;
    }
    if (pOut && (pOut->data)) {
        free(pOut->data);
        pOut->data = NULL;
    }
    if (pExtra) {
        free(pExtra);
        pExtra = NULL;
    }
    if (ctx) {
        vpuapi_close_ctx(&ctx);
        ctx = NULL;
    }
    if (pInFile) {
        fclose(pInFile);
        pInFile = NULL;
    }
    if (pOutFile) {
        fclose(pOutFile);
        pOutFile = NULL;
    }

    if (ret) {
        printf("decode demo fail, err: %d\n", ret);
    } else {
        printf("encode demo complete OK.\n");
    }
    return ret;
}